

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void SlowSort(array *p,size_t Count,size_t Width,arraycmp Cmp,void *CmpParam,bool_t Unique)

{
  long lVar1;
  array *paVar2;
  void *pvVar3;
  arraycmp p_Var4;
  undefined1 *puVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 uStack_70;
  undefined1 auStack_68 [8];
  char *local_60;
  long local_58;
  array *local_50;
  void *local_48;
  arraycmp local_40;
  undefined1 *local_38;
  
  lVar1 = -(Width + 0xf & 0xfffffffffffffff0);
  local_38 = auStack_68 + lVar1;
  local_58 = Unique;
  local_48 = CmpParam;
  local_40 = Cmp;
  if (p == (array *)0x0) {
    *(code **)((long)&uStack_70 + lVar1) = ArrayFindEx;
    __assert_fail("&(*p)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                  ,0x161,"void SlowSort(array *, size_t, size_t, arraycmp, const void *, bool_t)");
  }
  local_60 = p->_Begin + Count * Width;
  pcVar7 = local_60;
  pcVar8 = p->_Begin;
  local_50 = p;
  do {
    do {
      pcVar9 = pcVar8;
      p_Var4 = local_40;
      pvVar3 = local_48;
      paVar2 = local_50;
      pcVar8 = pcVar9 + Width;
      if (pcVar8 == pcVar7) {
        if (local_58 != 0) {
          pcVar8 = local_50->_Begin;
          pcVar9 = pcVar8;
          while (p_Var4 = local_40, pvVar3 = local_48, pcVar9 = pcVar9 + Width, pcVar9 != pcVar7) {
            *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f797;
            iVar6 = (*p_Var4)(pvVar3,pcVar9,pcVar8);
            if (iVar6 != 0) {
              pcVar8 = pcVar8 + Width;
              *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f7ac;
              memcpy(pcVar8,pcVar9,Width);
            }
          }
          paVar2->_Used = (size_t)(pcVar8 + (Width - (long)paVar2->_Begin));
        }
        return;
      }
      *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f714;
      iVar6 = (*p_Var4)(pvVar3,pcVar8,pcVar9);
      puVar5 = local_38;
    } while (-1 < iVar6);
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f727;
    memcpy(puVar5,pcVar8,Width);
    do {
      pcVar7 = pcVar9;
      *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f739;
      memcpy(pcVar7 + Width,pcVar7,Width);
      puVar5 = local_38;
      p_Var4 = local_40;
      pvVar3 = local_48;
      if (pcVar7 == local_50->_Begin) break;
      *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f754;
      iVar6 = (*p_Var4)(pvVar3,puVar5,pcVar7 + -Width);
      pcVar9 = pcVar7 + -Width;
    } while (iVar6 < 0);
    puVar5 = local_38;
    *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10f767;
    memcpy(pcVar7,puVar5,Width);
    pcVar7 = local_60;
  } while( true );
}

Assistant:

static void SlowSort(array* p, size_t Count, size_t Width, arraycmp Cmp, const void* CmpParam, bool_t Unique)
{
#if defined(_MSC_VER) && !defined (__clang__)
    uint8_t* Tmp = (uint8_t*)_alloca(Width);
#else
    uint8_t Tmp[Width];
#endif
    char* End = ARRAYBEGIN(*p,char) + Count*Width;
    char* i;
    char* j;

    j = p->_Begin;
    for (i=j+Width; i!=End; i+=Width)
    {
        if (Cmp(CmpParam,i,j) < 0)
        {
            memcpy(Tmp,i,Width);
            do
            {
                memcpy(j+Width,j,Width);
                if (j == p->_Begin)
                {
                    j -= Width;
                    break;
                }
                j -= Width;
            }
            while (Cmp(CmpParam,Tmp,j) < 0);
            memcpy(j+Width,Tmp,Width);
        }
        j = i;
    }

    if (Unique)
    {
        j = p->_Begin;
        for (i=j+Width; i!=End; i+=Width)
        {
            if (Cmp(CmpParam,i,j) != 0)
            {
                j += Width;
                memcpy(j,i,Width);
            }
        }
        p->_Used = j - p->_Begin + Width;
    }
}